

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_repl.c
# Opt level: O0

int repl_p_lru_new(repl_p_head **head)

{
  os_mutex_t *m;
  ringbuf *prVar1;
  repl_p_head *h;
  repl_p_head **head_local;
  
  m = (os_mutex_t *)Zalloc(0x48);
  if (m == (os_mutex_t *)0x0) {
    head_local._4_4_ = -1;
  }
  else {
    util_mutex_init(m);
    m[1].align = 0;
    *(os_mutex_t **)((long)m + 0x38) = m + 1;
    prVar1 = ringbuf_new(0x1000);
    *(ringbuf **)((long)m + 0x40) = prVar1;
    *head = (repl_p_head *)m;
    head_local._4_4_ = 0;
  }
  return head_local._4_4_;
}

Assistant:

static int
repl_p_lru_new(struct repl_p_head **head)
{
	struct repl_p_head *h = Zalloc(sizeof(struct repl_p_head));
	if (h == NULL)
		return -1;

	util_mutex_init(&h->lock);
	TAILQ_INIT(&h->first);
	h->ringbuf = ringbuf_new(LEN_RING_BUF);
	*head = h;

	return 0;
}